

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall sptk::Matrix::FillDiagonal(Matrix *this,double value)

{
  int *piVar1;
  reference ppdVar2;
  long in_RDI;
  Matrix *in_XMM0_Qa;
  int i;
  int num_ones;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  Matrix *pMVar5;
  
  Fill(in_XMM0_Qa,(double)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  piVar1 = std::min<int>((int *)(in_RDI + 8),(int *)(in_RDI + 0xc));
  iVar4 = *piVar1;
  for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    pMVar5 = in_XMM0_Qa;
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),(long)iVar3)
    ;
    (*ppdVar2)[iVar3] = (double)in_XMM0_Qa;
    in_XMM0_Qa = pMVar5;
  }
  return;
}

Assistant:

void Matrix::FillDiagonal(double value) {
  Fill(0.0);
  const int num_ones(std::min(num_row_, num_column_));
  for (int i(0); i < num_ones; ++i) {
    index_[i][i] = value;
  }
}